

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.C
# Opt level: O0

CmdLineArg * __thiscall
CmdLine::next(CmdLineArg *__return_storage_ptr__,CmdLine *this,int argc,char **argv)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *local_40;
  char *end;
  CmdLineOption *opt;
  char *pcStack_28;
  bool longOpt;
  char *arg;
  char **argv_local;
  int argc_local;
  CmdLine *this_local;
  
  this->_idx = this->_idx + 1;
  if (this->_idx < argc) {
    pcStack_28 = argv[this->_idx];
    if (*pcStack_28 == '-') {
      bVar1 = false;
      if ((*pcStack_28 == '-') && (pcStack_28 = pcStack_28 + 1, *pcStack_28 == '\0')) {
        CmdLineArg::CmdLineArg(__return_storage_ptr__,'\x02',argv[this->_idx],(char *)0x0);
      }
      else {
        if (*pcStack_28 == '-') {
          pcStack_28 = pcStack_28 + 1;
          if (*pcStack_28 == '\0') {
            CmdLineArg::CmdLineArg(__return_storage_ptr__,'\x02',argv[this->_idx],(char *)0x0);
            return __return_storage_ptr__;
          }
          bVar1 = true;
        }
        for (end = (char *)this->_opts; local_40 = (char *)0x0, end[0xc] != '\0'; end = end + 0x10)
        {
          if (bVar1) {
            if (*(long *)end != 0) {
              __s2 = *(char **)end;
              sVar3 = strlen(*(char **)end);
              iVar2 = strncmp(pcStack_28,__s2,sVar3);
              if (iVar2 == 0) {
                sVar3 = strlen(*(char **)end);
                local_40 = pcStack_28 + sVar3;
                if ((*local_40 == '\0') || (*local_40 == '=')) break;
              }
            }
          }
          else if (*pcStack_28 == end[0xc]) {
            local_40 = pcStack_28 + 1;
            break;
          }
        }
        if ((end[0xc] == '\0') || (local_40 == (char *)0x0)) {
          CmdLineArg::CmdLineArg(__return_storage_ptr__,'\x02',argv[this->_idx],(char *)0x0);
        }
        else {
          if (*(int *)(end + 8) == 2) {
            if (*local_40 == '=') {
              CmdLineArg::CmdLineArg(__return_storage_ptr__,end[0xc],*(char **)end,local_40 + 1);
              return __return_storage_ptr__;
            }
            if (*local_40 == '\0') {
              this->_idx = this->_idx + 1;
              if (argc <= this->_idx) {
                CmdLineArg::CmdLineArg
                          (__return_storage_ptr__,'\x03',argv[this->_idx + -1],(char *)0x0);
                return __return_storage_ptr__;
              }
              CmdLineArg::CmdLineArg(__return_storage_ptr__,end[0xc],*(char **)end,argv[this->_idx])
              ;
              return __return_storage_ptr__;
            }
          }
          if (*local_40 == '\0') {
            CmdLineArg::CmdLineArg(__return_storage_ptr__,end[0xc],*(char **)end,(char *)0x0);
          }
          else {
            CmdLineArg::CmdLineArg(__return_storage_ptr__,'\x02',argv[this->_idx],(char *)0x0);
          }
        }
      }
    }
    else {
      CmdLineArg::CmdLineArg(__return_storage_ptr__,'\x01',argv[this->_idx],(char *)0x0);
    }
  }
  else {
    CmdLineArg::CmdLineArg(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CmdLineArg const CmdLine::next(int argc, char * argv[])
{
    ++_idx;
    if (_idx >= argc) {
        return CmdLineArg();
    }

    char const * arg = argv[_idx];

    // Is it a command line argument?
    if (*arg != '-') {
        return CmdLineArg(CmdLineArg::NO_OPTION, argv[_idx]);
    }

    // Otherwise it is a short or long command line option
    bool longOpt = false;
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
    }
    if (*arg == '-') {
        ++arg;
        if (*arg == '\0') {
            return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
        }
        longOpt = true;
    }

    // The rest shall be the command line option
    CmdLineOption const * opt = _opts;
    char const * end = nullptr;
    for (; opt->shortName != '\0'; ++opt) {
        if (longOpt) {
            if (opt->longName != nullptr && strncmp(arg, opt->longName, strlen(opt->longName)) == 0) {
                end = arg + strlen(opt->longName);
                // Shall end with '\0' or '='
                if (*end == '\0' || *end == '=') {
                    break;
                }
                // Otherwise keep looking for matches
                end = nullptr;
            }
        }
        else {
            if (*arg == opt->shortName) {
                end = arg + 1;
                break;
            }
        }
    }

    // Is it an invalid option
    if (opt->shortName == '\0' || end == nullptr) {
        return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
    }

    // Does it require arguments?
    if (opt->flag == CmdLineOption::RequiredArgument) {
        // Shall end with '=' or '\0'
        if (*end == '=') {
            ++end;
            return CmdLineArg(opt->shortName, opt->longName, end);
        }
        else if (*end == '\0') {
            // Argument is next
            ++_idx;
            if (_idx >= argc) {
                return CmdLineArg(CmdLineArg::REQUIRES_ARGUMENT, argv[_idx - 1]);
            }
            return CmdLineArg(opt->shortName, opt->longName, argv[_idx]);
        }
    }

    // Does not require arguments; end shall be '\0'
    if (*end == '\0') {
        return CmdLineArg(opt->shortName, opt->longName);
    }

    // Otherwise this is an invalid option
    return CmdLineArg(CmdLineArg::INVALID_OPTION, argv[_idx]);
}